

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

size_t duckdb_je_arena_fill_small_fresh
                 (tsdn_t *tsdn,arena_t *arena,szind_t binind,void **ptrs,size_t nfill,_Bool zero)

{
  edata_t **ppeVar1;
  pthread_mutex_t *__mutex;
  long *plVar2;
  char cVar3;
  uint uVar4;
  size_t sVar5;
  bitmap_t bVar6;
  uint uVar7;
  int iVar8;
  arena_t *paVar9;
  bitmap_t *pbVar10;
  arena_t *paVar11;
  ulong uVar12;
  size_t sVar13;
  edata_t *slab;
  ulong uVar14;
  arena_t *arena_00;
  ulong uVar15;
  undefined1 auVar16 [16];
  uint local_a0;
  mutex_prof_data_t *data;
  long local_80;
  
  uVar7 = duckdb_je_manual_arena_base;
  local_a0 = 0;
  if ((tsdn != (tsdn_t *)0x0) &&
     ((tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena != (arena_t *)0x0)) {
    local_a0 = (uint)(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_binshards.
                     binshard[binind];
  }
  uVar12 = (ulong)(local_a0 << 8);
  if (binind < duckdb_je_bin_info_nbatched_sizes) {
    uVar12 = (ulong)local_a0 * 0x288;
  }
  uVar4 = arena->ind;
  slab = (edata_t *)((long)&arena->nthreads[0].repr + uVar12 + duckdb_je_arena_bin_offsets[binind]);
  if (nfill == 0) {
    paVar11 = (arena_t *)0x0;
    local_80 = 0;
    sVar13 = 0;
LAB_00ce1ef4:
    arena_00 = (arena_t *)0x0;
  }
  else {
    uVar12 = (ulong)duckdb_je_bin_infos[binind].nregs;
    sVar5 = duckdb_je_bin_infos[binind].reg_size;
    sVar13 = 0;
    local_80 = 0;
    paVar11 = (arena_t *)0x0;
    do {
      paVar9 = (arena_t *)arena_slab_alloc(tsdn,arena,binind,local_a0,duckdb_je_bin_infos + binind);
      if (paVar9 == (arena_t *)0x0) goto LAB_00ce1ef4;
      uVar15 = nfill - sVar13;
      uVar14 = uVar12;
      if (uVar15 < uVar12) {
        uVar14 = uVar15;
      }
      arena_slab_reg_alloc_batch
                ((edata_t *)paVar9,duckdb_je_bin_infos + binind,(uint)uVar14,ptrs + sVar13);
      if (zero) {
        switchD_012e3010::default(ptrs[sVar13],0,uVar14 * sVar5);
      }
      arena_00 = paVar9;
      if (uVar12 <= uVar15) {
        arena_00 = (arena_t *)0x0;
      }
      if (uVar12 <= uVar15 && uVar7 <= uVar4) {
        (((anon_union_24_2_895ac29c_for_edata_s_6 *)&(paVar9->stats).metadata_rtree)->ql_link_active
        ).qre_next = (edata_t *)paVar9;
        (paVar9->stats).resident = (size_t)paVar9;
        if (paVar11 != (arena_t *)0x0) {
          (((anon_union_24_2_895ac29c_for_edata_s_6 *)&(paVar9->stats).metadata_rtree)->
          ql_link_active).qre_next = (edata_t *)(paVar11->stats).resident;
          (paVar11->stats).resident = (size_t)paVar9;
          (paVar9->stats).resident = *(size_t *)((paVar9->stats).resident + 0x28);
          *(arena_t **)((paVar11->stats).resident + 0x28) = paVar11;
          *(arena_t **)((paVar9->stats).resident + 0x28) = paVar9;
          paVar9 = (arena_t *)
                   (((anon_union_24_2_895ac29c_for_edata_s_6 *)&(paVar9->stats).metadata_rtree)->
                   ql_link_active).qre_next;
        }
        arena_00 = (arena_t *)0x0;
        paVar11 = paVar9;
      }
      sVar13 = sVar13 + uVar14;
      local_80 = local_80 + 1;
    } while (sVar13 < nfill);
  }
  __mutex = (pthread_mutex_t *)((long)&slab->field_6 + 8);
  paVar9 = paVar11;
  iVar8 = pthread_mutex_trylock(__mutex);
  if (iVar8 != 0) {
    duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)slab);
    *(undefined1 *)&slab->field_6 = 1;
  }
  plVar2 = (long *)((long)&slab->field_5 + 0x10);
  *plVar2 = *plVar2 + 1;
  if ((slab->field_5).ql_link_active.qre_prev != (edata_t *)tsdn) {
    (slab->field_5).ql_link_active.qre_prev = (edata_t *)tsdn;
    (slab->field_5).ql_link_active.qre_next =
         (edata_t *)((long)&((slab->field_5).ql_link_active.qre_next)->e_bits + 1);
  }
  if (arena_00 != (arena_t *)0x0) {
    arena_bin_lower_slab((tsdn_t *)arena,arena_00,slab,(bin_t *)paVar9);
  }
  if (uVar7 <= uVar4) {
    pbVar10 = slab[1].field_6.e_slab_data.bitmap + 7;
    bVar6 = slab[1].field_6.e_slab_data.bitmap[7];
    if (bVar6 != 0) {
      if (paVar11 == (arena_t *)0x0) goto LAB_00ce1faa;
      *(undefined8 *)((paVar11->stats).resident + 0x28) = *(undefined8 *)(bVar6 + 0x30);
      sVar5 = (paVar11->stats).resident;
      *(size_t *)(*pbVar10 + 0x30) = sVar5;
      (paVar11->stats).resident = *(size_t *)(sVar5 + 0x28);
      *(bitmap_t *)(*(long *)(*pbVar10 + 0x30) + 0x28) = *pbVar10;
      pbVar10 = (bitmap_t *)((paVar11->stats).resident + 0x28);
    }
    *pbVar10 = (bitmap_t)paVar11;
  }
LAB_00ce1faa:
  slab[1].e_sn = slab[1].e_sn + local_80;
  ppeVar1 = &slab[1].field_5.ql_link_active.qre_prev;
  *ppeVar1 = (edata_t *)((long)&(*ppeVar1)->e_bits + local_80);
  pbVar10 = (slab->field_6).e_slab_data.bitmap + 6;
  *pbVar10 = *pbVar10 + sVar13;
  auVar16._8_4_ = (int)sVar13;
  auVar16._0_8_ = sVar13;
  auVar16._12_4_ = (int)(sVar13 >> 0x20);
  slab[1].e_bits = sVar13 + slab[1].e_bits;
  slab[1].e_addr = (void *)(auVar16._8_8_ + (long)slab[1].e_addr);
  *(undefined1 *)&slab->field_6 = 0;
  pthread_mutex_unlock(__mutex);
  if (tsdn != (tsdn_t *)0x0) {
    cVar3 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
    iVar8 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.
            tick;
    (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.tick =
         iVar8 + -1;
    if (iVar8 < 1) {
      if (cVar3 < '\x01') {
        uVar12 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state *
                 0x5851f42d4c957f2d + 0x14057b7ef767814f;
        (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state = uVar12;
        (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.tick =
             (int32_t)(((ulong)duckdb_je_ticker_geom_table[uVar12 >> 0x3a] *
                       (long)(tsdn->tsd).
                             cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker
                             .nticks) / 0x3d);
        duckdb_je_arena_decay(tsdn,arena,false,false);
      }
      else {
        (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.tick =
             0;
      }
    }
  }
  return sVar13;
}

Assistant:

size_t
arena_fill_small_fresh(tsdn_t *tsdn, arena_t *arena, szind_t binind,
    void **ptrs, size_t nfill, bool zero) {
	assert(binind < SC_NBINS);
	const bin_info_t *bin_info = &bin_infos[binind];
	const size_t nregs = bin_info->nregs;
	assert(nregs > 0);
	const size_t usize = bin_info->reg_size;

	const bool manual_arena = !arena_is_auto(arena);
	unsigned binshard;
	bin_t *bin = arena_bin_choose(tsdn, arena, binind, &binshard);

	size_t nslab = 0;
	size_t filled = 0;
	edata_t *slab = NULL;
	edata_list_active_t fulls;
	edata_list_active_init(&fulls);

	while (filled < nfill && (slab = arena_slab_alloc(tsdn, arena, binind,
	    binshard, bin_info)) != NULL) {
		assert((size_t)edata_nfree_get(slab) == nregs);
		++nslab;
		size_t batch = nfill - filled;
		if (batch > nregs) {
			batch = nregs;
		}
		assert(batch > 0);
		arena_slab_reg_alloc_batch(slab, bin_info, (unsigned)batch,
		    &ptrs[filled]);
		assert(edata_addr_get(slab) == ptrs[filled]);
		if (zero) {
			memset(ptrs[filled], 0, batch * usize);
		}
		filled += batch;
		if (batch == nregs) {
			if (manual_arena) {
				edata_list_active_append(&fulls, slab);
			}
			slab = NULL;
		}
	}

	malloc_mutex_lock(tsdn, &bin->lock);
	/*
	 * Only the last slab can be non-empty, and the last slab is non-empty
	 * iff slab != NULL.
	 */
	if (slab != NULL) {
		arena_bin_lower_slab(tsdn, arena, slab, bin);
	}
	if (manual_arena) {
		edata_list_active_concat(&bin->slabs_full, &fulls);
	}
	assert(edata_list_active_empty(&fulls));
	if (config_stats) {
		bin->stats.nslabs += nslab;
		bin->stats.curslabs += nslab;
		bin->stats.nmalloc += filled;
		bin->stats.nrequests += filled;
		bin->stats.curregs += filled;
	}
	malloc_mutex_unlock(tsdn, &bin->lock);

	arena_decay_tick(tsdn, arena);
	return filled;
}